

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O1

_Bool sysbvm_tuple_equals(sysbvm_context_t *context,sysbvm_tuple_t a,sysbvm_tuple_t b)

{
  ulong uVar1;
  sysbvm_tuple_t *psVar2;
  sysbvm_tuple_t function;
  sysbvm_tuple_t sVar3;
  byte bVar4;
  sysbvm_tuple_t local_38;
  sysbvm_tuple_t local_30;
  
  uVar1 = a & 0xf;
  psVar2 = (sysbvm_tuple_t *)a;
  if (uVar1 == 0 && a != 0) {
LAB_001397bf:
    sVar3 = *psVar2;
  }
  else {
    if ((int)uVar1 != 0xf) {
      psVar2 = (context->roots).immediateTypeTable + uVar1;
      goto LAB_001397bf;
    }
    if (a < 0x60) {
      psVar2 = (context->roots).immediateTrivialTypeTable + (a >> 4);
      goto LAB_001397bf;
    }
    sVar3 = 0;
  }
  if (sVar3 != 0) {
    function = sysbvm_type_getEqualsFunction(context,sVar3);
    sVar3 = function;
    if (function != 0) {
      local_38 = a;
      local_30 = b;
      sVar3 = sysbvm_function_apply(context,function,2,&local_38,0);
      sVar3 = (sysbvm_tuple_t)(sVar3 == 0x1f);
    }
    bVar4 = (byte)sVar3;
    if (function != 0) goto LAB_00139808;
  }
  bVar4 = a == b;
LAB_00139808:
  return (_Bool)(bVar4 & 1);
}

Assistant:

SYSBVM_API bool sysbvm_tuple_equals(sysbvm_context_t *context, sysbvm_tuple_t a, sysbvm_tuple_t b)
{
    sysbvm_tuple_t type = sysbvm_tuple_getType(context, a);
    if(type)
    {
        sysbvm_tuple_t equalsFunction = sysbvm_type_getEqualsFunction(context, type);
        if(equalsFunction)
            return sysbvm_tuple_boolean_decode(sysbvm_function_apply2(context, equalsFunction, a, b));
    }

    return sysbvm_tuple_identityEquals(a, b);
}